

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O3

void __thiscall
BamTools::PileupEngine::PileupEnginePrivate::CreatePileupData(PileupEnginePrivate *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pBVar3;
  int iVar4;
  pointer this_00;
  pointer al;
  
  ClearOldData(this);
  iVar4 = this->CurrentPosition;
  pPVar1 = (this->CurrentPileupData).PileupAlignments.
           super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->CurrentPileupData).RefId = this->CurrentId;
  (this->CurrentPileupData).Position = iVar4;
  pPVar2 = (this->CurrentPileupData).PileupAlignments.
           super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      BamAlignment::~BamAlignment(&this_00->Alignment);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->CurrentPileupData).PileupAlignments.
    super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pBVar3 = (this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (al = (this->CurrentAlignments).
            super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
            _M_impl.super__Vector_impl_data._M_start; al != pBVar3; al = al + 1) {
    ParseAlignmentCigar(this,al);
  }
  return;
}

Assistant:

void PileupEngine::PileupEnginePrivate::CreatePileupData()
{

    // remove any non-overlapping alignments
    ClearOldData();

    // set pileup refId, position to current markers
    CurrentPileupData.RefId = CurrentId;
    CurrentPileupData.Position = CurrentPosition;
    CurrentPileupData.PileupAlignments.clear();

    // parse CIGAR data in remaining alignments
    std::vector<BamAlignment>::const_iterator alIter = CurrentAlignments.begin();
    std::vector<BamAlignment>::const_iterator alEnd = CurrentAlignments.end();
    for (; alIter != alEnd; ++alIter) {
        ParseAlignmentCigar((*alIter));
    }
}